

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_artifacts.cpp
# Opt level: O2

bool __thiscall APowerup::HandlePickup(APowerup *this,AInventory *item)

{
  int iVar1;
  PClass *pPVar2;
  PClass *pPVar3;
  int iVar4;
  uint uVar5;
  APowerup *power;
  
  pPVar2 = DObject::GetClass((DObject *)item);
  pPVar3 = DObject::GetClass((DObject *)this);
  if (pPVar2 != pPVar3) goto LAB_00498b5f;
  uVar5 = item->ItemFlags;
  iVar4 = *(int *)&item->field_0x4fc;
  if (iVar4 != 0) {
    iVar1 = *(int *)&(this->super_AInventory).field_0x4fc;
    if ((uVar5 >> 9 & 1) == 0) {
      if ((uVar5 >> 10 & 1) == 0 && 0x80 < iVar1) goto LAB_00498b5f;
      if (iVar1 < iVar4) goto LAB_00498b3c;
    }
    else {
      iVar4 = iVar4 + iVar1;
LAB_00498b3c:
      *(int *)&(this->super_AInventory).field_0x4fc = iVar4;
      (this->BlendColor).field_0 = *(anon_union_4_2_12391d7c_for_PalEntry_0 *)(item + 1);
    }
    uVar5 = item->ItemFlags;
  }
  item->ItemFlags = uVar5 | 4;
LAB_00498b5f:
  return pPVar2 == pPVar3;
}

Assistant:

bool APowerup::HandlePickup (AInventory *item)
{
	if (item->GetClass() == GetClass())
	{
		APowerup *power = static_cast<APowerup*>(item);
		if (power->EffectTics == 0)
		{
			power->ItemFlags |= IF_PICKUPGOOD;
			return true;
		}
		// Color gets transferred if the new item has an effect.

		// Increase the effect's duration.
		if (power->ItemFlags & IF_ADDITIVETIME) 
		{
			EffectTics += power->EffectTics;
			BlendColor = power->BlendColor;
		}
		// If it's not blinking yet, you can't replenish the power unless the
		// powerup is required to be picked up.
		else if (EffectTics > BLINKTHRESHOLD && !(power->ItemFlags & IF_ALWAYSPICKUP))
		{
			return true;
		}
		// Reset the effect duration.
		else if (power->EffectTics > EffectTics)
		{
			EffectTics = power->EffectTics;
			BlendColor = power->BlendColor;
		}
		power->ItemFlags |= IF_PICKUPGOOD;
		return true;
	}
	return false;
}